

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic_vector.h
# Opt level: O0

void __thiscall
bwtil::dynamic_vector<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>::dynamic_vector
          (dynamic_vector<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_> *this,
          ulint max_length,uint width)

{
  undefined4 in_EDX;
  undefined8 in_RSI;
  undefined4 *in_RDI;
  bitvector_t<4096UL,_(bv::allocation_policy_t)0> *in_stack_ffffffffffffffb8;
  bitvector_t<4096UL,_(bv::allocation_policy_t)0> *this_00;
  size_t in_stack_ffffffffffffffd0;
  size_t in_stack_ffffffffffffffd8;
  bitvector_t<4096UL,_(bv::allocation_policy_t)0> *in_stack_ffffffffffffffe0;
  
  *in_RDI = 0x40;
  *(undefined8 *)(in_RDI + 2) = 0;
  *(undefined8 *)(in_RDI + 4) = 0;
  this_00 = (bitvector_t<4096UL,_(bv::allocation_policy_t)0> *)(in_RDI + 6);
  bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>::bitvector_t
            ((bitvector_t<4096UL,_(bv::allocation_policy_t)0> *)0x12ca10);
  *in_RDI = in_EDX;
  *(undefined8 *)(in_RDI + 2) = in_RSI;
  bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>::bitvector_t
            (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
  bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>::operator=(this_00,in_stack_ffffffffffffffb8);
  bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>::~bitvector_t
            ((bitvector_t<4096UL,_(bv::allocation_policy_t)0> *)0x12ca5f);
  return;
}

Assistant:

dynamic_vector(ulint max_length, uint width){

		this->width=width;
		this->max_length=max_length;

		/*
		 * create a dynamic bitvector with max size the max number of bits of this dynamic vector
		 * and using the default word size for the nodes of the B tree
		 */
		bv = dynamic_bitvector_type(max_length*width);

	}